

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExternalFunction.cpp
# Opt level: O2

void __thiscall
Js::JavascriptExternalFunction::JavascriptExternalFunction
          (JavascriptExternalFunction *this,DynamicType *type,InitializeMethod method,
          unsigned_short deferredSlotCount,bool accessors)

{
  undefined3 in_register_00000081;
  
  RuntimeFunction::RuntimeFunction
            (&this->super_RuntimeFunction,type,
             (FunctionInfo *)EntryInfo::DefaultExternalFunctionThunk);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01397ac8;
  this->flags = 0;
  (this->signature).ptr = (void *)0x0;
  (this->callbackState).ptr = (void *)0x0;
  (this->field_3).nativeMethod = (Type)0x0;
  Memory::WriteBarrierPtr<int_(void_*)>::WriteBarrierSet
            (&this->initMethod,(_func_int_void_ptr *)method);
  *(uint *)&this->field_0x68 =
       (uint)deferredSlotCount * 2 + 1 & 0xffff | CONCAT31(in_register_00000081,accessors) << 0x10 |
       *(uint *)&this->field_0x68 & 0xfe0000;
  JavascriptFunction::VerifyEntryPoint((JavascriptFunction *)this);
  return;
}

Assistant:

JavascriptExternalFunction::JavascriptExternalFunction(DynamicType* type, InitializeMethod method, unsigned short deferredSlotCount, bool accessors)
        : RuntimeFunction(type, &EntryInfo::DefaultExternalFunctionThunk), nativeMethod(nullptr), signature(nullptr), callbackState(nullptr), initMethod(method),
        oneBit(1), typeSlots(deferredSlotCount), hasAccessors(accessors), flags(0), deferredLength(0)
    {
        DebugOnly(VerifyEntryPoint());
    }